

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void action_shovel(tgestate_t *state)

{
  int iVar1;
  
  if (state->room_index == '2') {
    iVar1 = get_roomdef(state,'2',2);
    if (iVar1 != 0xff) {
      set_roomdef(state,'2',2,0xff);
      set_roomdef(state,'2',0x17,0);
      setup_room(state);
      choose_game_window_attributes(state);
      plot_interior_tiles(state);
      increase_morale_by_10_score_by_50(state);
      return;
    }
  }
  return;
}

Assistant:

void action_shovel(tgestate_t *state)
{
  assert(state != NULL);

  if (state->room_index != room_50_BLOCKED_TUNNEL)
    return; /* Shovel only works in the blocked tunnel room. */

  if (get_roomdef(state, room_50_BLOCKED_TUNNEL, roomdef_50_BOUNDARY) == 255)
    return; /* Blockage is already cleared. */

  /* Release boundary. */
  set_roomdef(state,
              room_50_BLOCKED_TUNNEL,
              roomdef_50_BOUNDARY,
              255);
  /* Remove blockage graphic. */
  set_roomdef(state,
              room_50_BLOCKED_TUNNEL,
              roomdef_50_BLOCKAGE,
              interiorobject_STRAIGHT_TUNNEL_SW_NE);

  // FUTURE: setup_room_and_plot could replace the setup_room and plot_interior_tiles calls
  setup_room(state);
  choose_game_window_attributes(state);
  plot_interior_tiles(state);
  increase_morale_by_10_score_by_50(state);
}